

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_ModuleInfoStream.cpp
# Opt level: O0

Module * __thiscall PDB::ModuleInfoStream::FindLinkerModule(ModuleInfoStream *this)

{
  int iVar1;
  char *__s1;
  ArrayView<char> local_40;
  Module *local_30;
  Module *module;
  size_t i;
  size_t count;
  ModuleInfoStream *this_local;
  
  i = this->m_moduleCount;
  module = (Module *)0x0;
  count = (size_t)this;
  while( true ) {
    if (i <= module) {
      return (Module *)0x0;
    }
    local_30 = this->m_modules + (i - (long)module) + -1;
    local_40 = Module::GetName(local_30);
    __s1 = ArrayView<char>::Decay(&local_40);
    iVar1 = strcmp(__s1,"* Linker *");
    if (iVar1 == 0) break;
    module = (Module *)((long)&module->m_info + 1);
  }
  return local_30;
}

Assistant:

PDB_NO_DISCARD const PDB::ModuleInfoStream::Module* PDB::ModuleInfoStream::FindLinkerModule(void) const PDB_NO_EXCEPT
{
	const size_t count = m_moduleCount;
	for (size_t i = 0u; i < count; ++i)
	{
		// with both MSVC cl.exe and Clang, the linker symbol is the last one to be stored, so start searching from the end
		const Module& module = m_modules[count - i - 1u];

		// check if this is the linker symbol
		if (std::strcmp(module.GetName().Decay(), LinkerSymbolName) == 0)
		{
			return &module;
		}
	}

	return nullptr;
}